

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

int __thiscall
GF2::MP<6UL,_GF2::MOGrlex<6UL>_>::Compare
          (MP<6UL,_GF2::MOGrlex<6UL>_> *this,MP<6UL,_GF2::MOGrlex<6UL>_> *polyRight)

{
  int iVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var2 = (_List_node_base *)this;
  p_Var3 = (_List_node_base *)polyRight;
  while( true ) {
    p_Var2 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var2->_M_next)->
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var3 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var3->_M_next)->
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if ((p_Var2 == (_List_node_base *)this) || (p_Var3 == (_List_node_base *)polyRight)) break;
    iVar1 = MOGrlex<6UL>::Compare
                      ((MOGrlex<6UL> *)&this->field_0x18,(MM<6UL> *)(p_Var2 + 1),
                       (MM<6UL> *)(p_Var3 + 1));
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  if (p_Var2 != (_List_node_base *)this) {
    return 1;
  }
  return -(uint)(p_Var3 != (_List_node_base *)polyRight);
}

Assistant:

int Compare(const MP& polyRight) const
	{
		assert(IsConsistent(polyRight));
		// цикл по мономам
		const_iterator iter = begin(), iterRight = polyRight.begin();
		for (; iter != end() && iterRight != polyRight.end(); ++iter, ++iterRight)
			if (int cmp = _order.Compare(*iter, *iterRight))
				return cmp;
		// проверка хвостов
		if (iter == end()) 
			return iterRight == polyRight.end() ? 0 : -1;
        return 1;
	}